

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O2

void __thiscall
groundupdbext::MemoryKeyValueStore::setKeyValue
          (MemoryKeyValueStore *this,HashedValue *key,EncodedValue *value)

{
  Impl *pIVar1;
  long *plVar2;
  __hashtable *__h;
  pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue> local_a0;
  
  std::
  _Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(this->mImpl)._M_t.
                super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>.
                _M_head_impl);
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>._M_head_impl;
  std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>::
  pair<groundupdb::EncodedValue_&,_true>(&local_a0,key,value);
  std::
  _Hashtable<groundupdb::HashedValue,std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>,std::allocator<std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>>,std::__detail::_Select1st,std::equal_to<groundupdb::HashedValue>,groundupdbext::HighwayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>>
            ((_Hashtable<groundupdb::HashedValue,std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>,std::allocator<std::pair<groundupdb::HashedValue_const,groundupdb::EncodedValue>>,std::__detail::_Select1st,std::equal_to<groundupdb::HashedValue>,groundupdbext::HighwayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pIVar1,&local_a0);
  std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>::~pair(&local_a0);
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>._M_head_impl;
  if (*(bool *)((long)&(pIVar1->m_cachedStore).
                       super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
               + 8) == true) {
    plVar2 = *(long **)&(pIVar1->m_cachedStore).
                        super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
                        ._M_payload;
    groundupdb::EncodedValue::EncodedValue((EncodedValue *)&local_a0,value);
    (**(code **)(*plVar2 + 0x10))(plVar2,key,&local_a0);
    groundupdb::HashedValue::~HashedValue((HashedValue *)&local_a0.first.m_has_value);
  }
  return;
}

Assistant:

void
MemoryKeyValueStore::setKeyValue(const HashedValue& key,EncodedValue&& value)
{
  // Also write to our in-memory unordered map
  // Note: insert on unordered_map does NOT perform an insert if the key already exists
  mImpl->m_keyValueStore.erase(key);
  mImpl->m_keyValueStore.insert({key,value});
  if (mImpl->m_cachedStore) {
    mImpl->m_cachedStore->get()->setKeyValue(key,EncodedValue(value)); // force copy construction of a temporary
  }
}